

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O0

int ECDSA_SIG_set0(ECDSA_SIG *sig,BIGNUM *r,BIGNUM *s)

{
  BIGNUM *s_local;
  BIGNUM *r_local;
  ECDSA_SIG *sig_local;
  
  if ((r == (BIGNUM *)0x0) || (s == (BIGNUM *)0x0)) {
    sig_local._4_4_ = 0;
  }
  else {
    BN_free((BIGNUM *)sig->r);
    BN_free((BIGNUM *)sig->s);
    sig->r = r;
    sig->s = s;
    sig_local._4_4_ = 1;
  }
  return sig_local._4_4_;
}

Assistant:

int ECDSA_SIG_set0(ECDSA_SIG *sig, BIGNUM *r, BIGNUM *s) {
  if (r == NULL || s == NULL) {
    return 0;
  }
  BN_free(sig->r);
  BN_free(sig->s);
  sig->r = r;
  sig->s = s;
  return 1;
}